

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_trim_u64(nng_msg *m,uint64_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  size_t sVar9;
  byte *pbVar10;
  uint64_t v;
  uint8_t *body;
  uint64_t *vp_local;
  nng_msg *m_local;
  
  sVar9 = nni_msg_len(m);
  if (sVar9 < 8) {
    m_local._4_4_ = 3;
  }
  else {
    pbVar10 = (byte *)nni_msg_body(m);
    bVar1 = *pbVar10;
    bVar2 = pbVar10[1];
    bVar3 = pbVar10[2];
    bVar4 = pbVar10[3];
    bVar5 = pbVar10[4];
    bVar6 = pbVar10[5];
    bVar7 = pbVar10[6];
    bVar8 = pbVar10[7];
    nni_msg_trim(m,8);
    *vp = ((ulong)bVar1 << 0x38) + ((ulong)bVar2 << 0x30) + ((ulong)bVar3 << 0x28) +
          ((ulong)bVar4 << 0x20) + (ulong)bVar5 * 0x1000000 + (ulong)bVar6 * 0x10000 +
          (ulong)bVar7 * 0x100 + (ulong)bVar8;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nng_msg_trim_u64(nng_msg *m, uint64_t *vp)
{
	uint8_t *body;
	uint64_t v;
	if (nni_msg_len(m) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	NNI_GET64(body, v);
	(void) nni_msg_trim(m, sizeof(v));
	*vp = v;
	return (0);
}